

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdAuto.c
# Opt level: O2

Vec_Ptr_t * Cmf_CreateOptions(Vec_Wec_t *vPars)

{
  anon_union_4_2_947302e2 v;
  uint uVar1;
  float fVar2;
  Vec_Ptr_t *vOpts;
  Vec_Int_t *p;
  int Argc;
  int iVar3;
  int i;
  char Argv [100] [20];
  
  vOpts = Vec_PtrAlloc((int)vPars);
  p = Vec_WecEntry(vPars,0);
  puts("Creating all possible settings to be used by the autotuner:");
  builtin_strncpy(Argv[0],"autotuner",10);
  i = 1;
  Argc = 1;
  while( true ) {
    if (p->nSize <= i) break;
    uVar1 = Vec_IntEntry(p,i + -1);
    fVar2 = (float)Vec_IntEntry(p,i);
    iVar3 = Argc + 1;
    sprintf(Argv[Argc],"-%c",(ulong)uVar1);
    if (0.0 <= fVar2) {
      if ((fVar2 != (float)(int)fVar2) || (NAN(fVar2) || NAN((float)(int)fVar2))) {
        sprintf(Argv[iVar3],"%.3f",(double)fVar2);
      }
      else {
        sprintf(Argv[iVar3],"%d",(ulong)(uint)(int)fVar2);
      }
      iVar3 = Argc + 2;
    }
    i = i + 2;
    Argc = iVar3;
  }
  Cmf_CreateOptions_rec(vPars,1,Argv,Argc,vOpts);
  printf("Finished creating %d settings.\n\n",(long)vOpts->nSize / 2 & 0xffffffff,
         (long)vOpts->nSize % 2 & 0xffffffff);
  return vOpts;
}

Assistant:

Vec_Ptr_t * Cmf_CreateOptions( Vec_Wec_t * vPars )
{
    char Argv[CMD_AUTO_ARG_MAX][20];
    int Symb, Num, i, Argc = 0;
    Vec_Ptr_t * vOpts = Vec_PtrAlloc( 100 );
    Vec_Int_t * vLine = Vec_WecEntry( vPars, 0 );
    printf( "Creating all possible settings to be used by the autotuner:\n" );
    sprintf( Argv[Argc++], "autotuner" );
    Vec_IntForEachEntryDouble( vLine, Symb, Num, i )
    {
        float NumF = Abc_Int2Float(Num);
        sprintf( Argv[Argc++], "-%c", Symb );
        if ( NumF < 0.0 )
            continue;
        if ( NumF == (float)(int)NumF )
            sprintf( Argv[Argc++], "%d", (int)NumF );
        else
            sprintf( Argv[Argc++], "%.3f", NumF );
    }
    Cmf_CreateOptions_rec( vPars, 1, Argv, Argc, vOpts );
    printf( "Finished creating %d settings.\n\n", Vec_PtrSize(vOpts)/2 );
    return vOpts;
}